

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

int __thiscall amrex::AmrLevel::derive(AmrLevel *this,EVP_PKEY_CTX *ctx,uchar *key,size_t *keylen)

{
  DistributionMapping *dm;
  FArrayBox *pFVar1;
  FArrayBox *__args_4;
  pointer pSVar2;
  AmrLevel *pAVar3;
  Geometry *pGVar4;
  Real *pRVar5;
  undefined8 uVar6;
  bool bVar7;
  IndexType typ;
  int iVar8;
  int iVar9;
  DeriveRec *pDVar10;
  DeriveBoxMap p_Var11;
  int *piVar12;
  long lVar13;
  pointer *ppbVar14;
  pointer *ppbVar15;
  DeriveFunc p_Var16;
  DeriveFunc3D p_Var17;
  int *piVar18;
  int iVar19;
  pointer pbVar20;
  int k;
  BoxArray *rhs;
  int dc;
  int dcomp;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  int index;
  int ngrow_local;
  int scomp;
  AmrLevel *local_378;
  int ncomp;
  pointer local_368;
  pointer local_360;
  DeriveRec *local_358;
  AmrLevel *local_350;
  int n_state;
  int n_der;
  int grid_no;
  Geometry *local_338;
  int dncomp;
  int *local_328;
  Real *local_320;
  Box *local_318;
  IntVect *local_310;
  double *local_308;
  double *local_300;
  int *local_2f8;
  Real dt;
  Box bx1;
  pointer pbStack_2c8;
  int local_2c0;
  Vector<int,_std::allocator<int>_> *local_2b0;
  Vector<int,_std::allocator<int>_> *local_2a8;
  Real time_local;
  RealBox *local_280;
  DeriveFunc local_278;
  int *local_270;
  Box local_264;
  RealBox temp;
  BoxArray dstBA;
  MultiFab srcMF;
  
  local_360 = (pointer)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  ngrow_local = (int)keylen;
  this->_vptr_AmrLevel = (_func_int **)0x0;
  local_350 = this;
  bVar7 = isStateVariable((string *)key,&index,&scomp);
  if (bVar7) {
    bx1.smallend.vect[0] = 1;
    srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase = (_func_int **)0x1
    ;
    srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat._0_8_ = 0;
    srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ = 0;
    srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._12_8_ = 0;
    srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._20_8_ = 0;
    std::
    make_unique<amrex::MultiFab,amrex::BoxArray_const&,amrex::DistributionMapping&,int,int&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
              (&dstBA,(DistributionMapping *)(*(long *)(ctx + 0x170) + (long)index * 0xe0 + 0x30),
               (int *)(ctx + 0x140),(int *)&bx1,(MFInfo *)&ngrow_local,
               (FabFactory<amrex::FArrayBox> *)&srcMF);
    uVar6 = dstBA.m_bat._0_8_;
    pAVar3 = local_350;
    local_350->_vptr_AmrLevel = (_func_int **)dstBA.m_bat._0_8_;
    dstBA.m_bat._0_8_ = 0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                  m_bndryReg.m_typ);
    FillPatch((AmrLevel *)ctx,(MultiFab *)uVar6,ngrow_local,(Real)local_360,index,scomp,1,0);
    local_350 = pAVar3;
  }
  else {
    local_378 = (AmrLevel *)ctx;
    pDVar10 = DeriveList::get((DeriveList *)derive_lst,(string *)key);
    if (pDVar10 == (DeriveRec *)0x0) {
      std::__cxx11::string::string
                ((string *)&srcMF,"AmrLevel::derive(MultiFab*): unknown variable: ",
                 (allocator *)&dstBA);
      std::__cxx11::string::append((string *)&srcMF);
      Error_host((char *)srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.
                         _vptr_FabArrayBase);
      std::__cxx11::string::~string((string *)&srcMF);
    }
    else {
      DeriveRec::getRange(pDVar10,0,&index,&scomp,&ncomp);
      rhs = (BoxArray *)
            ((long)((local_378->state).
                    super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                    super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                    super__Vector_impl_data._M_start + index) + 0x30);
      local_358 = pDVar10;
      BoxArray::BoxArray(&dstBA,rhs);
      pDVar10 = local_358;
      typ = DeriveRec::deriveType(local_358);
      BoxArray::convert(&dstBA,typ);
      iVar19 = ngrow_local;
      BoxArray::operator[]((Box *)&srcMF,rhs,0);
      p_Var11 = DeriveRec::boxMap(pDVar10);
      (*p_Var11)(&bx1,(Box *)&srcMF);
      pAVar3 = local_378;
      iVar19 = ((int)srcMF.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase -
               bx1.smallend.vect[0]) + iVar19;
      dm = &local_378->dmap;
      iVar8 = DeriveRec::numState(pDVar10);
      bx1.smallend.vect[0] = 1;
      bx1.smallend.vect[1] = 0;
      bx1.smallend.vect[2] = 0;
      bx1.bigend.vect[0] = 0;
      bx1.bigend.vect[1] = 0;
      bx1.bigend.vect[2] = 0;
      stack0xfffffffffffffd30 = (pointer)0x0;
      pbStack_2c8 = (pointer)0x0;
      local_368 = (pointer)dm;
      MultiFab::MultiFab(&srcMF,rhs,dm,iVar8,iVar19,(MFInfo *)&bx1,
                         (pAVar3->m_factory)._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(bx1.bigend.vect + 1));
      pDVar10 = local_358;
      dcomp = 0;
      for (iVar8 = 0; iVar9 = DeriveRec::numRange(pDVar10), iVar8 < iVar9; iVar8 = iVar8 + 1) {
        DeriveRec::getRange(pDVar10,iVar8,&index,&scomp,&ncomp);
        FillPatch(local_378,&srcMF,iVar19,(Real)local_360,index,scomp,ncomp,dcomp);
        dcomp = dcomp + ncomp;
      }
      dncomp = DeriveRec::numDerive(pDVar10);
      bx1.smallend.vect[0] = 1;
      bx1.smallend.vect[1] = 0;
      bx1.smallend.vect[2] = 0;
      bx1.bigend.vect[0] = 0;
      bx1.bigend.vect[1] = 0;
      bx1.bigend.vect[2] = 0;
      stack0xfffffffffffffd30 = (pointer)0x0;
      pbStack_2c8 = (pointer)0x0;
      std::
      make_unique<amrex::MultiFab,amrex::BoxArray&,amrex::DistributionMapping&,int_const&,int&,amrex::MFInfo,amrex::FabFactory<amrex::FArrayBox>&>
                ((BoxArray *)&temp,(DistributionMapping *)&dstBA,(int *)local_368,&dncomp,
                 (MFInfo *)&ngrow_local,(FabFactory<amrex::FArrayBox> *)&bx1);
      pbVar20 = (pointer)temp.xlo[0];
      local_350->_vptr_AmrLevel = (_func_int **)temp.xlo[0];
      temp.xlo[0] = 0.0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(bx1.bigend.vect + 1));
      DeriveRec::derFuncFab((DeriveFuncFab *)&bx1,pDVar10);
      uVar6 = bx1.bigend.vect._4_8_;
      std::_Function_base::~_Function_base((_Function_base *)&bx1);
      local_368 = pbVar20;
      if (uVar6 == 0) {
        MFIter::MFIter((MFIter *)&bx1,(FabArrayBase *)pbVar20,true);
        local_320 = (local_378->geom).super_CoordSys.dx;
        local_280 = &(local_378->geom).prob_domain;
        local_328 = &local_378->level;
        while( true ) {
          ppbVar15 = &pbStack_2c8;
          lVar13 = (long)(int)pbStack_2c8;
          if (local_2c0 <= (int)pbStack_2c8) break;
          grid_no = (local_2b0->super_vector<int,_std::allocator<int>_>).
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_start[lVar13];
          if (local_2a8 != (Vector<int,_std::allocator<int>_> *)0x0) {
            lVar13 = (long)(local_2a8->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar13];
          }
          local_300 = BaseFab<double>::dataPtr
                                (*(BaseFab<double> **)(pbVar20[8]._M_string_length + lVar13 * 8),0);
          ppbVar14 = ppbVar15;
          if (local_2a8 != (Vector<int,_std::allocator<int>_> *)0x0) {
            ppbVar14 = (pointer *)
                       ((local_2a8->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + (int)pbStack_2c8);
          }
          lVar13 = *(long *)(pbVar20[8]._M_string_length + (long)*(int *)ppbVar14 * 8);
          MFIter::growntilebox(&local_264,(MFIter *)&bx1,-1000000);
          n_der = DeriveRec::numDerive(pDVar10);
          ppbVar14 = ppbVar15;
          if (local_2a8 != (Vector<int,_std::allocator<int>_> *)0x0) {
            ppbVar14 = (pointer *)
                       ((local_2a8->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + (int)pbStack_2c8);
          }
          local_308 = BaseFab<double>::dataPtr
                                (&srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                                  super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>
                                  ._M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar14]->
                                  super_BaseFab<double>,0);
          if (local_2a8 != (Vector<int,_std::allocator<int>_> *)0x0) {
            ppbVar15 = (pointer *)
                       ((local_2a8->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + (int)pbStack_2c8);
          }
          local_2f8 = (int *)(lVar13 + 0x24);
          pFVar1 = srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                   super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                   _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar15];
          local_360 = (pointer)&(pFVar1->super_BaseFab<double>).domain;
          local_310 = &(pFVar1->super_BaseFab<double>).domain.bigend;
          n_state = DeriveRec::numState(pDVar10);
          pAVar3 = local_378;
          pSVar2 = (local_378->state).
                   super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
                   super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
                   super__Vector_impl_data._M_start;
          local_318 = (Box *)((long)(pSVar2 + index) + 0x10);
          local_338 = (Geometry *)((long)(pSVar2 + index) + 0x1c);
          local_270 = DeriveRec::getBC(local_358);
          pRVar5 = local_320;
          RealBox::RealBox(&temp,&local_264,local_320,local_280->xlo);
          pDVar10 = local_358;
          dt = (pAVar3->parent->dt_level).super_vector<double,_std::allocator<double>_>.
               super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
               _M_start[pAVar3->level];
          p_Var16 = DeriveRec::derFunc(local_358);
          piVar12 = local_2f8;
          pGVar4 = local_338;
          pbVar20 = local_360;
          if (p_Var16 == (DeriveFunc)0x0) {
            p_Var17 = DeriveRec::derFunc3D(pDVar10);
            if (p_Var17 == (DeriveFunc3D)0x0) {
              Error_host("AmrLevel::derive: no function available");
            }
            else {
              piVar18 = DeriveRec::getBC3D(pDVar10);
              p_Var17 = DeriveRec::derFunc3D(pDVar10);
              (*p_Var17)(local_300,(int *)(lVar13 + 0x18),piVar12,&n_der,local_308,(int *)pbVar20,
                         local_310->vect,&n_state,(int *)&local_264,local_264.bigend.vect,
                         (int *)local_318,(int *)pGVar4,local_320,temp.xlo,&time_local,&dt,piVar18,
                         local_328,&grid_no);
            }
          }
          else {
            local_278 = DeriveRec::derFunc(pDVar10);
            pDVar10 = local_358;
            (*local_278)(local_300,(int *)(lVar13 + 0x18),(int *)(lVar13 + 0x1c),
                         (int *)(lVar13 + 0x20),local_2f8,(int *)(lVar13 + 0x28),
                         (int *)(lVar13 + 0x2c),&n_der,local_308,(int *)local_360,
                         (pFVar1->super_BaseFab<double>).domain.smallend.vect + 1,
                         (pFVar1->super_BaseFab<double>).domain.smallend.vect + 2,local_310->vect,
                         (pFVar1->super_BaseFab<double>).domain.bigend.vect + 1,
                         (pFVar1->super_BaseFab<double>).domain.bigend.vect + 2,&n_state,
                         (int *)&local_264,local_264.bigend.vect,(int *)local_318,(int *)local_338,
                         pRVar5,temp.xlo,&time_local,&dt,local_270,local_328,&grid_no);
          }
          pbVar20 = local_368;
          MFIter::operator++((MFIter *)&bx1);
        }
      }
      else {
        MFIter::MFIter((MFIter *)&bx1,(FabArrayBase *)pbVar20,true);
        local_338 = &local_378->geom;
        while( true ) {
          if (local_2c0 <= (int)pbStack_2c8) break;
          MFIter::growntilebox(&local_264,(MFIter *)&bx1,ngrow_local);
          pDVar10 = local_358;
          ppbVar15 = &pbStack_2c8;
          if (local_2a8 != (Vector<int,_std::allocator<int>_> *)0x0) {
            ppbVar15 = (pointer *)
                       ((local_2a8->super_vector<int,_std::allocator<int>_>).
                        super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start + (int)pbStack_2c8);
          }
          pFVar1 = *(FArrayBox **)(pbVar20[8]._M_string_length + (long)*(int *)ppbVar15 * 8);
          __args_4 = srcMF.super_FabArray<amrex::FArrayBox>.m_fabs_v.
                     super__Vector_base<amrex::FArrayBox_*,_std::allocator<amrex::FArrayBox_*>_>.
                     _M_impl.super__Vector_impl_data._M_start[*(int *)ppbVar15];
          DeriveRec::derFuncFab((DeriveFuncFab *)&temp,local_358);
          iVar19 = dncomp;
          piVar12 = DeriveRec::getBC(pDVar10);
          std::
          function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
          ::operator()((function<void_(const_amrex::Box_&,_amrex::FArrayBox_&,_int,_int,_const_amrex::FArrayBox_&,_const_amrex::Geometry_&,_double,_const_int_*,_int)>
                        *)&temp,&local_264,pFVar1,0,iVar19,__args_4,local_338,(double)local_360,
                       piVar12,local_378->level);
          std::_Function_base::~_Function_base((_Function_base *)&temp);
          MFIter::operator++((MFIter *)&bx1);
          pbVar20 = local_368;
        }
      }
      MFIter::~MFIter((MFIter *)&bx1);
      MultiFab::~MultiFab(&srcMF);
      BoxArray::~BoxArray(&dstBA);
    }
  }
  return (int)local_350;
}

Assistant:

std::unique_ptr<MultiFab>
AmrLevel::derive (const std::string& name, Real time, int ngrow)
{
    BL_ASSERT(ngrow >= 0);

    std::unique_ptr<MultiFab> mf;

    int index, scomp, ncomp;

    if (isStateVariable(name, index, scomp))
    {
        mf = std::make_unique<MultiFab>(state[index].boxArray(), dmap, 1, ngrow, MFInfo(), *m_factory);
        FillPatch(*this,*mf,ngrow,time,index,scomp,1,0);
    }
    else if (const DeriveRec* rec = derive_lst.get(name))
    {
        rec->getRange(0, index, scomp, ncomp);

        const BoxArray& srcBA = state[index].boxArray();

        BoxArray dstBA(srcBA);
        dstBA.convert(rec->deriveType());

        int ngrow_src = ngrow;
        {
            Box bx0 = srcBA[0];
            Box bx1 = rec->boxMap()(bx0);
            int g = bx0.smallEnd(0) - bx1.smallEnd(0);
            ngrow_src += g;
        }

        MultiFab srcMF(srcBA, dmap, rec->numState(), ngrow_src, MFInfo(), *m_factory);

        for (int k = 0, dc = 0; k < rec->numRange(); k++, dc += ncomp)
        {
            rec->getRange(k, index, scomp, ncomp);
            FillPatch(*this,srcMF,ngrow_src,time,index,scomp,ncomp,dc);
        }

        const int dncomp = rec->numDerive();
        mf = std::make_unique<MultiFab>(dstBA, dmap, dncomp, ngrow, MFInfo(), *m_factory);

        if (rec->derFuncFab() != nullptr)
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
            for (MFIter mfi(*mf,TilingIfNotGPU()); mfi.isValid(); ++mfi)
            {
                const Box& bx = mfi.growntilebox(ngrow);
                FArrayBox& derfab = (*mf)[mfi];
                FArrayBox const& datafab = srcMF[mfi];
                rec->derFuncFab()(bx, derfab, 0, dncomp, datafab, geom, time, rec->getBC(), level);
            }
        }
        else
        {
#ifdef AMREX_USE_OMP
#pragma omp parallel
#endif
        for (MFIter mfi(*mf,true); mfi.isValid(); ++mfi)
        {
            int         grid_no = mfi.index();
            Real*       ddat    = (*mf)[mfi].dataPtr();
            const int*  dlo     = (*mf)[mfi].loVect();
            const int*  dhi     = (*mf)[mfi].hiVect();
            const Box&  gtbx    = mfi.growntilebox();
            const int*  lo      = gtbx.loVect();
            const int*  hi      = gtbx.hiVect();
            int         n_der   = rec->numDerive();
            Real*       cdat    = srcMF[mfi].dataPtr();
            const int*  clo     = srcMF[mfi].loVect();
            const int*  chi     = srcMF[mfi].hiVect();
            int         n_state = rec->numState();
            const int*  dom_lo  = state[index].getDomain().loVect();
            const int*  dom_hi  = state[index].getDomain().hiVect();
            const Real* dx      = geom.CellSize();
            const int*  bcr     = rec->getBC();
            const RealBox temp    (gtbx,geom.CellSize(),geom.ProbLo());
            const Real* xlo     = temp.lo();
            Real        dt      = parent->dtLevel(level);

            if (rec->derFunc() != static_cast<DeriveFunc>(0)){
               rec->derFunc()(ddat,AMREX_ARLIM(dlo),AMREX_ARLIM(dhi),&n_der,
                              cdat,AMREX_ARLIM(clo),AMREX_ARLIM(chi),&n_state,
                              lo,hi,dom_lo,dom_hi,dx,xlo,&time,&dt,bcr,
                              &level,&grid_no);
            } else if (rec->derFunc3D() != static_cast<DeriveFunc3D>(0)){
               const int *bc3D = rec->getBC3D();
               rec->derFunc3D()(ddat,AMREX_ARLIM_3D(dlo),AMREX_ARLIM_3D(dhi),&n_der,
                                cdat,AMREX_ARLIM_3D(clo),AMREX_ARLIM_3D(chi),&n_state,
                                AMREX_ARLIM_3D(lo),AMREX_ARLIM_3D(hi),
                                AMREX_ARLIM_3D(dom_lo),AMREX_ARLIM_3D(dom_hi),
                                AMREX_ZFILL(dx),AMREX_ZFILL(xlo),
                                &time,&dt,
                                bc3D,
                                &level,&grid_no);
            } else {
               amrex::Error("AmrLevel::derive: no function available");
            }
        }
        }
    }
    else
    {
        //
        // If we got here, cannot derive given name.
        //
        std::string msg("AmrLevel::derive(MultiFab*): unknown variable: ");
        msg += name;
        amrex::Error(msg.c_str());
    }

    return mf;
}